

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

Symbol __thiscall
google::protobuf::DescriptorBuilder::FindSymbolNotEnforcingDepsHelper
          (DescriptorBuilder *this,DescriptorPool *pool,string *name,bool build_it)

{
  bool bVar1;
  WrappedMutex *mu;
  Type TVar3;
  Symbol SVar4;
  MutexLockMaybe lock;
  anon_union_8_8_13f84498_for_Symbol_2 aVar2;
  
  if (this->pool_ == pool) {
    mu = (Mutex *)0x0;
  }
  else {
    mu = pool->mutex_;
  }
  internal::MutexLockMaybe::MutexLockMaybe(&lock,mu);
  SVar4 = DescriptorPool::Tables::FindSymbol
                    ((pool->tables_)._M_t.
                     super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                     .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                     _M_head_impl,name);
  aVar2 = SVar4.field_1;
  TVar3 = SVar4.type;
  if (TVar3 == NULL_SYMBOL) {
    if (pool->underlay_ == (DescriptorPool *)0x0) {
      TVar3 = NULL_SYMBOL;
    }
    else {
      SVar4 = FindSymbolNotEnforcingDepsHelper(this,pool->underlay_,name,true);
      aVar2 = SVar4.field_1;
      TVar3 = SVar4.type;
    }
    if (build_it && TVar3 == NULL_SYMBOL) {
      bVar1 = DescriptorPool::TryFindSymbolInFallbackDatabase(pool,name);
      TVar3 = NULL_SYMBOL;
      if (bVar1) {
        SVar4 = DescriptorPool::Tables::FindSymbol
                          ((pool->tables_)._M_t.
                           super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                           .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>
                           ._M_head_impl,name);
        aVar2 = SVar4.field_1;
        TVar3 = SVar4.type;
      }
    }
  }
  internal::MutexLockMaybe::~MutexLockMaybe(&lock);
  SVar4._4_4_ = 0;
  SVar4.type = TVar3;
  SVar4.field_1.descriptor = aVar2.descriptor;
  return SVar4;
}

Assistant:

Symbol DescriptorBuilder::FindSymbolNotEnforcingDepsHelper(
    const DescriptorPool* pool, const std::string& name, bool build_it) {
  // If we are looking at an underlay, we must lock its mutex_, since we are
  // accessing the underlay's tables_ directly.
  MutexLockMaybe lock((pool == pool_) ? nullptr : pool->mutex_);

  Symbol result = pool->tables_->FindSymbol(name);
  if (result.IsNull() && pool->underlay_ != nullptr) {
    // Symbol not found; check the underlay.
    result = FindSymbolNotEnforcingDepsHelper(pool->underlay_, name);
  }

  if (result.IsNull()) {
    // With lazily_build_dependencies_, a symbol lookup at cross link time is
    // not guaranteed to be successful. In most cases, build_it will be false,
    // which intentionally prevents us from building an import until it's
    // actually needed. In some cases, like registering an extension, we want
    // to build the file containing the symbol, and build_it will be set.
    // Also, build_it will be true when !lazily_build_dependencies_, to provide
    // better error reporting of missing dependencies.
    if (build_it && pool->TryFindSymbolInFallbackDatabase(name)) {
      result = pool->tables_->FindSymbol(name);
    }
  }

  return result;
}